

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Parser::Parse(Parser *this,ZeroCopyInputStream *input,Message *output)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ParserImpl parser;
  Descriptor *root_message_type;
  
  (*(output->super_MessageLite)._vptr_MessageLite[4])(output);
  iVar2 = (*(output->super_MessageLite)._vptr_MessageLite[0x13])(output);
  root_message_type = (Descriptor *)CONCAT44(extraout_var,iVar2);
  ParserImpl::ParserImpl
            (&parser,root_message_type,input,this->error_collector_,this->finder_,
             this->parse_info_tree_,FORBID_SINGULAR_OVERWRITES,this->allow_unknown_field_);
  bVar1 = MergeUsingImpl(this,(ZeroCopyInputStream *)root_message_type,output,&parser);
  ParserImpl::~ParserImpl(&parser);
  return bVar1;
}

Assistant:

bool TextFormat::Parser::Parse(io::ZeroCopyInputStream* input,
                               Message* output) {
  output->Clear();
  ParserImpl parser(output->GetDescriptor(), input, error_collector_,
                    finder_, parse_info_tree_,
                    ParserImpl::FORBID_SINGULAR_OVERWRITES,
                    allow_unknown_field_);
  return MergeUsingImpl(input, output, &parser);
}